

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O1

void __thiscall Map::eachScene(Map *this,function<void_(Scene_*)> *fn)

{
  pointer ppSVar1;
  char *dec;
  Scene *this_00;
  pointer ppSVar2;
  string sStack_80;
  function<void_(Scene_*)> *pfStack_60;
  pointer ppSStack_58;
  Decorator *pDStack_50;
  pointer ppSStack_48;
  undefined1 *puStack_40;
  Decorator local_30;
  
  this_00 = (Scene *)&std::cout;
  dec = "class:Map method:eachScene\n";
  puStack_40 = (undefined1 *)0x10daf5;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"class:Map method:eachScene\n",0x1b);
  ppSVar2 = (this->scenes).super__Vector_base<Scene_*,_std::allocator<Scene_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar1 = (this->scenes).super__Vector_base<Scene_*,_std::allocator<Scene_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppSVar2 != ppSVar1) {
    do {
      local_30._vptr_Decorator = (_func_int **)*ppSVar2;
      if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) {
        puStack_40 = (undefined1 *)0x10db37;
        std::__throw_bad_function_call();
        sStack_80._M_dataplus._M_p = (pointer)&sStack_80.field_2;
        pfStack_60 = fn;
        ppSStack_58 = ppSVar1;
        pDStack_50 = &local_30;
        ppSStack_48 = ppSVar2;
        puStack_40 = &stack0xfffffffffffffff8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_80,"Farm","");
        Scene::Scene(this_00,&sStack_80,(Decorator *)dec);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_80._M_dataplus._M_p != &sStack_80.field_2) {
          operator_delete(sStack_80._M_dataplus._M_p,sStack_80.field_2._M_allocated_capacity + 1);
        }
        (this_00->super_Observable)._vptr_Observable = (_func_int **)&PTR__Farm_00115780;
        return;
      }
      puStack_40 = (undefined1 *)0x10db1c;
      dec = (char *)&local_30;
      this_00 = (Scene *)fn;
      (*fn->_M_invoker)((_Any_data *)fn,(Scene **)&local_30);
      ppSVar2 = ppSVar2 + 1;
    } while (ppSVar2 != ppSVar1);
  }
  return;
}

Assistant:

void Map::eachScene(std::function<void(Scene *)> fn) {
    std::cout << "class:Map method:eachScene\n";
    for (auto i : scenes) {
        fn(i);
    }
}